

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplace<QRestAccessManagerPrivate::CallerInfo_const&>
          (QHash<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *this,QNetworkReply **key,
          CallerInfo *args)

{
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> _Var1;
  Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  CallerInfo local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = *(Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> **)
            this;
  if (pDVar2 == (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *
                )0x0) {
    local_38.contextObject.wp.d = (Data *)0x0;
LAB_0021f48f:
    pDVar2 = (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)
             0x0;
LAB_0021f4b0:
    pDVar2 = QHashPrivate::
             Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>::
             detached(pDVar2);
    *(Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> **)this =
         pDVar2;
LAB_0021f4b8:
    pVar3 = (piter)emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>(this,key,args);
    QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::~QHash
              ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)&local_38);
  }
  else {
    if (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_38.contextObject.wp.d = (Data *)pDVar2;
      if ((pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar2 = *(Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                   **)this;
        if (pDVar2 == (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                       *)0x0) goto LAB_0021f48f;
      }
      if (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0021f4b0;
      goto LAB_0021f4b8;
    }
    if ((DestroyerFn)pDVar2->size < (DestroyerFn)(pDVar2->numBuckets >> 1)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar3 = (piter)emplace_helper<QRestAccessManagerPrivate::CallerInfo_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_0021f58d;
    }
    local_38.contextObject.wp.d = (args->contextObject).wp.d;
    local_38.contextObject.wp.value = (args->contextObject).wp.value;
    if ((Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)
        local_38.contextObject.wp.d !=
        (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)0x0) {
      LOCK();
      (((Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)
       local_38.contextObject.wp.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (((Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)
            local_38.contextObject.wp.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _Var1._M_head_impl =
         (args->slot).obj._M_t.
         super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t
         .super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
         super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (QSlotObjectBase *)0x0) {
      local_38.slot.obj._M_t.
      super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
      super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
      super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
           (SlotObjUniquePtr)
           (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
            )0x0;
    }
    else {
      LOCK();
      (_Var1._M_head_impl)->m_ref = (QAtomicInt)(*(int *)&(_Var1._M_head_impl)->m_ref + 1);
      UNLOCK();
      local_38.slot.obj._M_t.
      super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
      super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
      super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
           (SlotObjUniquePtr)
           (args->slot).obj._M_t.
           super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>.
           _M_t.
           super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
           .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
    }
    pVar3 = (piter)QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>::
                   emplace_helper<QRestAccessManagerPrivate::CallerInfo>
                             ((QHash<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo> *)this,
                              key,&local_38);
    if (local_38.slot.obj._M_t.
        super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
        super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
        super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl !=
        (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
         )0x0) {
      LOCK();
      *(int *)local_38.slot.obj._M_t.
              super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
              ._M_t.
              super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
              .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
           *(int *)local_38.slot.obj._M_t.
                   super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                   .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl + -1;
      UNLOCK();
      if (*(int *)local_38.slot.obj._M_t.
                  super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                  .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl == 0) {
        (**(ImplFn *)
           ((long)local_38.slot.obj._M_t.
                  super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                  .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl + 8))
                  (0,(QSlotObjectBase *)
                     local_38.slot.obj._M_t.
                     super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>
                     .super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl,
                   (QObject *)0x0,(void **)0x0,(bool *)0x0);
      }
    }
    local_38.slot.obj._M_t.
    super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
    super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
    super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl =
         (SlotObjUniquePtr)
         (__uniq_ptr_data<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter,_true,_true>
          )0x0;
    if ((Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)
        local_38.contextObject.wp.d !=
        (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)0x0) {
      LOCK();
      ((local_38.contextObject.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i =
           ((local_38.contextObject.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.contextObject.wp.d)->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
        pDVar2 = (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                  *)local_38.contextObject.wp.d;
        if ((Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)
            local_38.contextObject.wp.d ==
            (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_> *)0x0
           ) {
          pDVar2 = (Data<QHashPrivate::Node<QNetworkReply_*,_QRestAccessManagerPrivate::CallerInfo>_>
                    *)0x0;
        }
        operator_delete(pDVar2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_0021f58d:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }